

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O3

void __thiscall
TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice
          (TimidityWaveWriterMIDIDevice *this,char *filename,int rate)

{
  FILE *__s;
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  DWORD work [3];
  undefined8 local_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined4 local_38;
  int local_34;
  int local_30;
  undefined8 local_2c;
  undefined8 local_24;
  undefined4 local_1c;
  undefined8 local_18;
  
  TimidityMIDIDevice::TimidityMIDIDevice(&this->super_TimidityMIDIDevice,(char *)0x0);
  (this->super_TimidityMIDIDevice).super_SoftSynthMIDIDevice.super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityWaveWriterMIDIDevice_006f10c0;
  __s = fopen(filename,"wb");
  this->File = (FILE *)__s;
  if (__s != (FILE *)0x0) {
    local_4c = 0x46464952;
    local_44 = 0x45564157;
    sVar1 = fwrite(&local_4c,4,3,__s);
    if (sVar1 == 3) {
      local_40 = 0x2820746d66;
      local_38 = 0x2fffe;
      local_34 = (int)((this->super_TimidityMIDIDevice).Renderer)->rate;
      local_30 = local_34 << 3;
      local_2c = 0x20001600200008;
      local_24 = 0x300000003;
      local_1c = 0x100000;
      local_18 = 0x719b3800aa000080;
      sVar1 = fwrite(&local_40,0x30,1,(FILE *)this->File);
      if (sVar1 == 1) {
        local_4c = 0x61746164;
        sVar1 = fwrite(&local_4c,4,2,(FILE *)this->File);
        if (sVar1 == 2) {
          return;
        }
      }
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    Printf("Failed to write %s: %s\n",filename,pcVar3);
    fclose((FILE *)this->File);
    this->File = (FILE *)0x0;
  }
  return;
}

Assistant:

TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice(const char *filename, int rate)
	:TimidityMIDIDevice(NULL)
{
	File = fopen(filename, "wb");
	if (File != NULL)
	{ // Write wave header
		DWORD work[3];
		FmtChunk fmt;

		work[0] = MAKE_ID('R','I','F','F');
		work[1] = 0;								// filled in later
		work[2] = MAKE_ID('W','A','V','E');
		if (3 != fwrite(work, 4, 3, File)) goto fail;

		fmt.ChunkID = MAKE_ID('f','m','t',' ');
		fmt.ChunkLen = LittleLong(DWORD(sizeof(fmt) - 8));
		fmt.FormatTag = LittleShort(0xFFFE);		// WAVE_FORMAT_EXTENSIBLE
		fmt.Channels = LittleShort(2);
		fmt.SamplesPerSec = LittleLong((int)Renderer->rate);
		fmt.AvgBytesPerSec = LittleLong((int)Renderer->rate * 8);
		fmt.BlockAlign = LittleShort(8);
		fmt.BitsPerSample = LittleShort(32);
		fmt.ExtensionSize = LittleShort(2 + 4 + 16);
		fmt.ValidBitsPerSample = LittleShort(32);
		fmt.ChannelMask = LittleLong(3);
		fmt.SubFormatA = LittleLong(0x00000003);	// Set subformat to KSDATAFORMAT_SUBTYPE_IEEE_FLOAT
		fmt.SubFormatB = LittleShort(0x0000);
		fmt.SubFormatC = LittleShort(0x0010);
		fmt.SubFormatD[0] = 0x80;
		fmt.SubFormatD[1] = 0x00;
		fmt.SubFormatD[2] = 0x00;
		fmt.SubFormatD[3] = 0xaa;
		fmt.SubFormatD[4] = 0x00;
		fmt.SubFormatD[5] = 0x38;
		fmt.SubFormatD[6] = 0x9b;
		fmt.SubFormatD[7] = 0x71;
		if (1 != fwrite(&fmt, sizeof(fmt), 1, File)) goto fail;

		work[0] = MAKE_ID('d','a','t','a');
		work[1] = 0;								// filled in later
		if (2 != fwrite(work, 4, 2, File)) goto fail;

		return;
fail:
		Printf("Failed to write %s: %s\n", filename, strerror(errno));
		fclose(File);
		File = NULL;
	}
}